

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

int __thiscall
CVmObjDate::getp_findWeekday(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int32_t *piVar1;
  int32_t iVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  vm_obj_id_t vVar6;
  char cVar7;
  uint uVar8;
  char cVar9;
  uint argc;
  int iVar10;
  uint uVar11;
  int32_t daytime;
  int32_t dayno;
  caldate_t cd;
  int32_t local_50;
  int32_t local_4c;
  CVmTimeZone *local_48;
  caldate_t local_3c;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (getp_findWeekday(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_findWeekday();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,oargc,&getp_findWeekday::desc);
  if (iVar4 == 0) {
    if (sp_[-1].typ == VM_INT) {
      vVar6 = sp_[-1].val.obj;
    }
    else {
      vVar6 = vm_val_t::nonint_num_to_int(sp_ + -1);
    }
    if (sp_[-2].typ == VM_INT) {
      uVar5 = sp_[-2].val.intval;
    }
    else {
      uVar5 = vm_val_t::nonint_num_to_int(sp_ + -2);
    }
    if ((vVar6 - 8 < 0xfffffff9) || (uVar5 == 0)) {
      err_throw(0x902);
    }
    local_48 = get_tz_arg(2,argc);
    piVar1 = (int32_t *)(this->super_CVmObject).ext_;
    local_4c = *piVar1;
    local_50 = piVar1[1];
    CVmTimeZone::utc_to_local(local_48,&local_4c,&local_50,&local_3c.y);
    iVar2 = local_4c;
    caldate_t::set_dayno(&local_3c,local_4c);
    local_3c.y = local_3c.y - (uint)((long)local_3c.m < 3);
    iVar4 = local_3c.y + 3;
    if (-1 < local_3c.y) {
      iVar4 = local_3c.y;
    }
    iVar10 = (int)((ulong)((long)local_3c.y * -0x51eb851f) >> 0x20);
    uVar11 = (vVar6 - (local_3c.y + local_3c.d + *(int *)(&DAT_002c330c + (long)local_3c.m * 4) +
                       (iVar4 >> 2) + ((iVar10 >> 5) - (iVar10 >> 0x1f)) + local_3c.y / 400) % 7) +
             6;
    cVar7 = (char)((uVar11 & 0xff) * 0x25 >> 8);
    cVar9 = (char)uVar11;
    bVar3 = cVar9 + ((byte)(((byte)(cVar9 - cVar7) >> 1) + cVar7) >> 2) * -7;
    uVar11 = (uint)bVar3;
    if ((int)uVar5 < 1) {
      uVar8 = uVar11 - 7;
      if (bVar3 == 0) {
        uVar8 = uVar11;
      }
      iVar4 = ~uVar5 * -7 + uVar8;
    }
    else {
      iVar4 = uVar5 * 7 + uVar11 + -7;
    }
    local_4c = iVar4 + iVar2;
    local_50 = 0;
    CVmTimeZone::local_to_utc(local_48,&local_4c,&local_50);
    vVar6 = create(0,local_4c,local_50);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar6;
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_findWeekday(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(2, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the day of week and 'which' arguments */
    int32_t wday = G_stk->get(0)->num_to_int(vmg0_);
    int32_t which = G_stk->get(1)->num_to_int(vmg0_);

    /* check the weekday and 'which' ranges */
    if (wday < 1 || wday > 7 || which == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* adjust wday to 0=Sunday */
    wday -= 1;

    /* get my date in local time */
    CVmTimeZone *tz = get_tz_arg(vmg_ 2, argc);
    int32_t dayno = get_local_date(tz);

    /* figure my weekday */
    caldate_t cd(dayno);
    int my_wday = cd.weekday();

    /* figure the difference between the target day and my day, mod 7 */
    int delta = (7 + wday - my_wday) % 7;

    /* 
     *   Go forward that many days, or backwards (7 - delta), to get the
     *   first occurrence before/after my date.  Then go forwards or
     *   backwards by additional weeks as needed.
     */
    if (which > 0)
        dayno += delta + (which-1)*7;
    else
        dayno -= ((7 - delta) % 7) + (-which-1)*7;

    /* return a new date at midnight on the given day */
    int32_t daytime = 0;
    tz->local_to_utc(dayno, daytime);
    retval->set_obj(create(vmg_ FALSE, dayno, daytime));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}